

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int mbedtls_internal_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  long lVar1;
  ulong uVar2;
  ulong local_2f8;
  uint64_t A [8];
  uint64_t W [80];
  uint64_t temp2;
  uint64_t temp1;
  int i;
  uchar *data_local;
  mbedtls_sha512_context *ctx_local;
  
  for (temp1._4_4_ = 0; temp1._4_4_ < 8; temp1._4_4_ = temp1._4_4_ + 1) {
    A[(long)temp1._4_4_ + -1] = ctx->state[temp1._4_4_];
  }
  for (temp1._4_4_ = 0; temp1._4_4_ < 0x10; temp1._4_4_ = temp1._4_4_ + 1) {
    A[(long)temp1._4_4_ + 7] =
         (ulong)data[temp1._4_4_ << 3] << 0x38 | (ulong)data[temp1._4_4_ * 8 + 1] << 0x30 |
         (ulong)data[temp1._4_4_ * 8 + 2] << 0x28 | (ulong)data[temp1._4_4_ * 8 + 3] << 0x20 |
         (ulong)data[temp1._4_4_ * 8 + 4] << 0x18 | (ulong)data[temp1._4_4_ * 8 + 5] << 0x10 |
         (ulong)data[temp1._4_4_ * 8 + 6] << 8 | (ulong)data[temp1._4_4_ * 8 + 7];
  }
  for (; temp1._4_4_ < 0x50; temp1._4_4_ = temp1._4_4_ + 1) {
    A[(long)temp1._4_4_ + 7] =
         ((A[(long)(temp1._4_4_ + -2) + 7] >> 0x13 | A[(long)(temp1._4_4_ + -2) + 7] << 0x2d) ^
          (A[(long)(temp1._4_4_ + -2) + 7] >> 0x3d | A[(long)(temp1._4_4_ + -2) + 7] << 3) ^
         A[(long)(temp1._4_4_ + -2) + 7] >> 6) + A[(long)(temp1._4_4_ + -7) + 7] +
         ((A[(long)(temp1._4_4_ + -0xf) + 7] >> 1 | A[(long)(temp1._4_4_ + -0xf) + 7] << 0x3f) ^
          (A[(long)(temp1._4_4_ + -0xf) + 7] >> 8 | A[(long)(temp1._4_4_ + -0xf) + 7] << 0x38) ^
         A[(long)(temp1._4_4_ + -0xf) + 7] >> 7) + A[(long)(temp1._4_4_ + -0x10) + 7];
  }
  temp1._4_4_ = 0;
  do {
    lVar1 = A[6] + ((A[3] >> 0xe | A[3] << 0x32) ^ (A[3] >> 0x12 | A[3] << 0x2e) ^
                   (A[3] >> 0x29 | A[3] << 0x17)) + (A[5] ^ A[3] & (A[4] ^ A[5])) + K[temp1._4_4_] +
            A[(long)temp1._4_4_ + 7];
    A[2] = lVar1 + A[2];
    A[6] = lVar1 + ((local_2f8 >> 0x1c | local_2f8 << 0x24) ^
                    (local_2f8 >> 0x22 | local_2f8 << 0x1e) ^
                   (local_2f8 >> 0x27 | local_2f8 << 0x19)) +
                   (local_2f8 & A[0] | A[1] & (local_2f8 | A[0]));
    lVar1 = A[5] + ((A[2] >> 0xe | A[2] << 0x32) ^ (A[2] >> 0x12 | A[2] << 0x2e) ^
                   (A[2] >> 0x29 | A[2] * 0x800000)) + (A[4] ^ A[2] & (A[3] ^ A[4])) +
            K[temp1._4_4_ + 1] + A[(long)(temp1._4_4_ + 1) + 7];
    A[1] = lVar1 + A[1];
    A[5] = lVar1 + ((A[6] >> 0x1c | A[6] << 0x24) ^ (A[6] >> 0x22 | A[6] * 0x40000000) ^
                   (A[6] >> 0x27 | A[6] * 0x2000000)) +
                   (A[6] & local_2f8 | A[0] & (A[6] | local_2f8));
    lVar1 = A[4] + ((A[1] >> 0xe | A[1] << 0x32) ^ (A[1] >> 0x12 | A[1] << 0x2e) ^
                   (A[1] >> 0x29 | A[1] * 0x800000)) + (A[3] ^ A[1] & (A[2] ^ A[3])) +
            K[temp1._4_4_ + 2] + A[(long)(temp1._4_4_ + 2) + 7];
    A[0] = lVar1 + A[0];
    A[4] = lVar1 + ((A[5] >> 0x1c | A[5] << 0x24) ^ (A[5] >> 0x22 | A[5] * 0x40000000) ^
                   (A[5] >> 0x27 | A[5] * 0x2000000)) + (A[5] & A[6] | local_2f8 & (A[5] | A[6]));
    lVar1 = A[3] + ((A[0] >> 0xe | A[0] << 0x32) ^ (A[0] >> 0x12 | A[0] << 0x2e) ^
                   (A[0] >> 0x29 | A[0] * 0x800000)) + (A[2] ^ A[0] & (A[1] ^ A[2])) +
            K[temp1._4_4_ + 3] + A[(long)(temp1._4_4_ + 3) + 7];
    uVar2 = lVar1 + local_2f8;
    A[3] = lVar1 + ((A[4] >> 0x1c | A[4] << 0x24) ^ (A[4] >> 0x22 | A[4] * 0x40000000) ^
                   (A[4] >> 0x27 | A[4] * 0x2000000)) + (A[4] & A[5] | A[6] & (A[4] | A[5]));
    lVar1 = A[2] + ((uVar2 >> 0xe | uVar2 << 0x32) ^ (uVar2 >> 0x12 | uVar2 << 0x2e) ^
                   (uVar2 >> 0x29 | uVar2 * 0x800000)) + (A[1] ^ uVar2 & (A[0] ^ A[1])) +
            K[temp1._4_4_ + 4] + A[(long)(temp1._4_4_ + 4) + 7];
    A[6] = lVar1 + A[6];
    A[2] = lVar1 + ((A[3] >> 0x1c | A[3] << 0x24) ^ (A[3] >> 0x22 | A[3] * 0x40000000) ^
                   (A[3] >> 0x27 | A[3] * 0x2000000)) + (A[3] & A[4] | A[5] & (A[3] | A[4]));
    lVar1 = A[1] + ((A[6] >> 0xe | A[6] << 0x32) ^ (A[6] >> 0x12 | A[6] << 0x2e) ^
                   (A[6] >> 0x29 | A[6] * 0x800000)) + (A[0] ^ A[6] & (uVar2 ^ A[0])) +
            K[temp1._4_4_ + 5] + A[(long)(temp1._4_4_ + 5) + 7];
    A[5] = lVar1 + A[5];
    A[1] = lVar1 + ((A[2] >> 0x1c | A[2] << 0x24) ^ (A[2] >> 0x22 | A[2] * 0x40000000) ^
                   (A[2] >> 0x27 | A[2] * 0x2000000)) + (A[2] & A[3] | A[4] & (A[2] | A[3]));
    lVar1 = A[0] + ((A[5] >> 0xe | A[5] << 0x32) ^ (A[5] >> 0x12 | A[5] << 0x2e) ^
                   (A[5] >> 0x29 | A[5] * 0x800000)) + (uVar2 ^ A[5] & (A[6] ^ uVar2)) +
            K[temp1._4_4_ + 6] + A[(long)(temp1._4_4_ + 6) + 7];
    A[4] = lVar1 + A[4];
    A[0] = lVar1 + ((A[1] >> 0x1c | A[1] << 0x24) ^ (A[1] >> 0x22 | A[1] * 0x40000000) ^
                   (A[1] >> 0x27 | A[1] * 0x2000000)) + (A[1] & A[2] | A[3] & (A[1] | A[2]));
    lVar1 = uVar2 + ((A[4] >> 0xe | A[4] << 0x32) ^ (A[4] >> 0x12 | A[4] << 0x2e) ^
                    (A[4] >> 0x29 | A[4] * 0x800000)) + (A[6] ^ A[4] & (A[5] ^ A[6])) +
            K[temp1._4_4_ + 7] + A[(long)(temp1._4_4_ + 7) + 7];
    A[3] = lVar1 + A[3];
    local_2f8 = lVar1 + ((A[0] >> 0x1c | A[0] << 0x24) ^ (A[0] >> 0x22 | A[0] * 0x40000000) ^
                        (A[0] >> 0x27 | A[0] * 0x2000000)) + (A[0] & A[1] | A[2] & (A[0] | A[1]));
    temp1._4_4_ = temp1._4_4_ + 8;
  } while (temp1._4_4_ < 0x50);
  for (temp1._4_4_ = 0; temp1._4_4_ < 8; temp1._4_4_ = temp1._4_4_ + 1) {
    ctx->state[temp1._4_4_] = A[(long)temp1._4_4_ + -1] + ctx->state[temp1._4_4_];
  }
  return 0;
}

Assistant:

int mbedtls_internal_sha512_process( mbedtls_sha512_context *ctx,
                                     const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A[8];

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (const unsigned char *)data != NULL );

#define  SHR(x,n) ((x) >> (n))
#define ROTR(x,n) (SHR((x),(n)) | ((x) << (64 - (n))))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) (((x) & (y)) | ((z) & ((x) | (y))))
#define F1(x,y,z) ((z) ^ ((x) & ((y) ^ (z))))

#define P(a,b,c,d,e,f,g,h,x,K)                                  \
    do                                                          \
    {                                                           \
        temp1 = (h) + S3(e) + F1((e),(f),(g)) + (K) + (x);      \
        temp2 = S2(a) + F0((a),(b),(c));                        \
        (d) += temp1; (h) = temp1 + temp2;                      \
    } while( 0 )

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA512_SMALLER)
    for( i = 0; i < 80; i++ )
    {
        if( i < 16 )
        {
            GET_UINT64_BE( W[i], data, i << 3 );
        }
        else
        {
            W[i] = S1(W[i -  2]) + W[i -  7] +
                   S0(W[i - 15]) + W[i - 16];
        }

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA512_SMALLER */
    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    i = 0;
    do
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] ); i++;
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i], K[i] ); i++;
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i], K[i] ); i++;
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i], K[i] ); i++;
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i], K[i] ); i++;
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i], K[i] ); i++;
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i], K[i] ); i++;
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i], K[i] ); i++;
    }
    while( i < 80 );
#endif /* MBEDTLS_SHA512_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}